

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::UnpackPSOSignatures<Diligent::RayTracingPipelineStateCreateInfo>
          (DearchiverBase *this,PSOData<Diligent::RayTracingPipelineStateCreateInfo> *PSO,
          IRenderDevice *pRenderDevice)

{
  bool bVar1;
  PSO_CREATE_INTERNAL_FLAGS PVar2;
  Char *Message;
  IPipelineResourceSignature **ppIVar3;
  IPipelineResourceSignature *pIVar4;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> local_90;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> pSignature;
  ResourceSignatureUnpackInfo UnpackInfo;
  Uint32 i;
  IPipelineResourceSignature **ppResourceSignatures;
  undefined1 local_50 [8];
  string msg;
  Uint32 ResourceSignaturesCount;
  IRenderDevice *pRenderDevice_local;
  PSOData<Diligent::RayTracingPipelineStateCreateInfo> *PSO_local;
  DearchiverBase *this_local;
  
  msg.field_2._12_4_ = (PSO->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount;
  if (msg.field_2._12_4_ == 0) {
    FormatString<char[91]>
              ((string *)local_50,
               (char (*) [91])
               "PSO must have at least one resource signature (including PSOs that use implicit signature)"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UnpackPSOSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x113);
    std::__cxx11::string::~string((string *)local_50);
    this_local._7_1_ = 1;
  }
  else {
    ppIVar3 = DynamicLinearAllocator::Allocate<Diligent::IPipelineResourceSignature*>
                        (&PSO->Allocator,(ulong)(uint)msg.field_2._12_4_);
    (PSO->CreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures = ppIVar3;
    for (UnpackInfo._20_4_ = 0; (uint)UnpackInfo._20_4_ < (uint)msg.field_2._12_4_;
        UnpackInfo._20_4_ = UnpackInfo._20_4_ + 1) {
      pSignature.m_pObject = (IPipelineResourceSignature *)pRenderDevice;
      std::array<const_char_*,_8UL>::operator[](&PSO->PRSNames,(ulong)(uint)UnpackInfo._20_4_);
      PVar2 = Diligent::operator&((PSO->InternalCI).Flags,
                                  PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0);
      (*(this->super_ObjectBase<Diligent::IDearchiver>).
        super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
        [0xe])(&local_90,this,&pSignature,(ulong)(PVar2 != PSO_CREATE_INTERNAL_FLAG_NONE));
      bVar1 = RefCntAutoPtr<Diligent::IPipelineResourceSignature>::operator!(&local_90);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      else {
        pIVar4 = Diligent::RefCntAutoPtr::operator_cast_to_IPipelineResourceSignature_
                           ((RefCntAutoPtr *)&local_90);
        ppIVar3[(uint)UnpackInfo._20_4_] = pIVar4;
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
        ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                    *)&PSO->Objects,&local_90);
      }
      RefCntAutoPtr<Diligent::IPipelineResourceSignature>::~RefCntAutoPtr(&local_90);
      if (bVar1) goto LAB_003186ef;
    }
    this_local._7_1_ = 1;
  }
LAB_003186ef:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DearchiverBase::UnpackPSOSignatures(PSOData<CreateInfoType>& PSO, IRenderDevice* pRenderDevice)
{
    const Uint32 ResourceSignaturesCount = PSO.CreateInfo.ResourceSignaturesCount;
    if (ResourceSignaturesCount == 0)
    {
        UNEXPECTED("PSO must have at least one resource signature (including PSOs that use implicit signature)");
        return true;
    }
    IPipelineResourceSignature** const ppResourceSignatures = PSO.Allocator.template Allocate<IPipelineResourceSignature*>(ResourceSignaturesCount);

    PSO.CreateInfo.ppResourceSignatures = ppResourceSignatures;
    for (Uint32 i = 0; i < ResourceSignaturesCount; ++i)
    {
        ResourceSignatureUnpackInfo UnpackInfo{pRenderDevice, PSO.PRSNames[i]};
        UnpackInfo.SRBAllocationGranularity = PSO.CreateInfo.PSODesc.SRBAllocationGranularity;

        auto pSignature = UnpackResourceSignature(UnpackInfo, (PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0);
        if (!pSignature)
            return false;

        ppResourceSignatures[i] = pSignature;
        PSO.Objects.emplace_back(std::move(pSignature));
    }
    return true;
}